

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O2

MPP_RET release_task_in_port(MppPort port)

{
  MPP_RET MVar1;
  MppTask mpp_task;
  MppFrame frame;
  MppPacket packet;
  
  packet = (MppPacket)0x0;
  frame = (MppFrame)0x0;
  do {
    MVar1 = _mpp_port_poll("release_task_in_port",port,MPP_POLL_NON_BLOCK);
    if (MVar1 < MPP_OK) {
      return MVar1;
    }
    _mpp_port_dequeue("release_task_in_port",port,&mpp_task);
    if (mpp_task == (MppTask)0x0) {
      _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"mpp_task",
                 "release_task_in_port",0xa2);
      if ((mpp_debug._3_1_ & 0x10) != 0) {
        abort();
      }
      if (mpp_task == (MppTask)0x0) {
        return 0x302c30;
      }
    }
    packet = (MppPacket)0x0;
    frame = (MppFrame)0x0;
    mpp_task_meta_get_frame(mpp_task,KEY_INPUT_FRAME,&frame);
    if (frame != (MppFrame)0x0) {
      mpp_frame_deinit(&frame);
      frame = (MppFrame)0x0;
    }
    mpp_task_meta_get_packet(mpp_task,KEY_OUTPUT_PACKET,&packet);
    if (packet != (MppPacket)0x0) {
      mpp_packet_deinit(&packet);
      packet = (MppPacket)0x0;
    }
    _mpp_port_enqueue("release_task_in_port",port,mpp_task);
    mpp_task = (MppTask)0x0;
  } while( true );
}

Assistant:

static MPP_RET release_task_in_port(MppPort port)
{
    MPP_RET ret = MPP_OK;
    MppPacket packet = NULL;
    MppFrame frame = NULL;
    MppTask mpp_task;

    do {
        ret = mpp_port_poll(port, MPP_POLL_NON_BLOCK);
        if (ret < 0)
            break;

        mpp_port_dequeue(port, &mpp_task);
        mpp_assert(mpp_task);
        if (mpp_task) {
            packet = NULL;
            frame = NULL;
            ret = mpp_task_meta_get_frame(mpp_task, KEY_INPUT_FRAME,  &frame);
            if (frame) {
                mpp_frame_deinit(&frame);
                frame = NULL;
            }
            ret = mpp_task_meta_get_packet(mpp_task, KEY_OUTPUT_PACKET, &packet);
            if (packet) {
                mpp_packet_deinit(&packet);
                packet = NULL;
            }

            mpp_port_enqueue(port, mpp_task);
            mpp_task = NULL;
        } else
            break;
    } while (1);

    return ret;
}